

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall kj::InputStream::skip(InputStream *this,size_t bytes)

{
  size_t in_RCX;
  ArrayPtr<unsigned_char> local_2048;
  ArrayPtr<unsigned_char> local_2038;
  unsigned_long local_2028;
  size_t local_2020;
  size_t amount;
  byte scratch [8192];
  size_t bytes_local;
  InputStream *this_local;
  
  scratch._8184_8_ = bytes;
  memset(&amount,0,0x2000);
  for (; scratch._8184_8_ != 0; scratch._8184_8_ = scratch._8184_8_ - local_2020) {
    local_2028 = 0x2000;
    local_2020 = min<unsigned_long&,unsigned_long>((unsigned_long *)(scratch + 0x1ff8),&local_2028);
    local_2048 = arrayPtr<unsigned_char,8192ul>((uchar (*) [8192])&amount);
    local_2038 = ArrayPtr<unsigned_char>::first(&local_2048,local_2020);
    read(this,(int)local_2038.ptr,(void *)local_2038.size_,in_RCX);
    in_RCX = local_2020;
  }
  return;
}

Assistant:

void InputStream::skip(size_t bytes) {
  byte scratch[8192]{};
  while (bytes > 0) {
    size_t amount = kj::min(bytes, sizeof(scratch));
    read(arrayPtr(scratch).first(amount));
    bytes -= amount;
  }
}